

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlyphBoundaries.cpp
# Opt level: O1

int GlyphBoundaries::OutputToGlatNonexistent(GrcBinaryStream *pbstrm)

{
  undefined8 in_RAX;
  undefined1 *os;
  undefined8 uStack_18;
  
  os = &(pbstrm->super_fstream).field_0x10;
  uStack_18 = in_RAX;
  GrcBinaryStream::write_16bits_be((ostream *)os,0);
  uStack_18._0_5_ = (uint5)(uint)uStack_18;
  std::ostream::write(os,(long)&uStack_18 + 4);
  uStack_18._0_6_ = (uint6)(uint5)uStack_18;
  std::ostream::write(os,(long)&uStack_18 + 5);
  uStack_18._0_7_ = (uint7)(uint6)uStack_18;
  std::ostream::write(os,(long)&uStack_18 + 6);
  uStack_18 = uStack_18 & 0xffffffffffffff;
  std::ostream::write(os,(long)&uStack_18 + 7);
  return 6;
}

Assistant:

int GlyphBoundaries::OutputToGlatNonexistent(GrcBinaryStream * pbstrm)
{
	// Empty bitmap
	pbstrm->WriteShort(0);
	// 4 bogus diagonals
	pbstrm->WriteByte(0);
	pbstrm->WriteByte(0);
	pbstrm->WriteByte(0);
	pbstrm->WriteByte(0);

	return 6;
}